

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureImageIterator::nextImage
          (TextureImageIterator *this)

{
  bool bVar1;
  int iVar2;
  undefined8 local_24;
  int local_1c;
  
  bVar1 = hasNextImage(this);
  if ((bVar1) &&
     (iVar2 = this->m_currentImage + 1, this->m_currentImage = iVar2,
     iVar2 == this->m_levelImageCount)) {
    iVar2 = this->m_currentLevel + 1;
    this->m_currentLevel = iVar2;
    this->m_currentImage = 0;
    getLevelSize((anon_unknown_0 *)&local_24,(this->m_info).m_target,&(this->m_info).m_size,iVar2);
    (this->m_levelSize).m_data[2] = local_1c;
    *(undefined8 *)(this->m_levelSize).m_data = local_24;
    if ((this->m_info).m_target == 0x8513) {
      iVar2 = 6;
    }
    else {
      iVar2 = (this->m_levelSize).m_data[2];
    }
    this->m_levelImageCount = iVar2;
  }
  return bVar1;
}

Assistant:

bool TextureImageIterator::nextImage (void)
{
	if (!hasNextImage())
		return false;

	m_currentImage++;
	if (m_currentImage == m_levelImageCount)
	{
		m_currentLevel++;
		m_currentImage		= 0;

		m_levelSize			= getLevelSize(m_info.getTarget(), m_info.getSize(), m_currentLevel);

		if (getTarget() == GL_TEXTURE_CUBE_MAP)
			m_levelImageCount = 6;
		else
			m_levelImageCount = m_levelSize.z();
	}
	DE_ASSERT(m_currentLevel < m_levelCount);
	DE_ASSERT(m_currentImage < m_levelImageCount);
	return true;
}